

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countryflags.cpp
# Opt level: O0

void __thiscall
CCountryFlags::Render
          (CCountryFlags *this,int CountryCode,vec4 *pColor,float x,float y,float w,float h,
          bool AllowBlocked)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  CCountryFlag *pCVar4;
  IGraphics *pIVar5;
  ITextRender *pIVar6;
  byte in_CL;
  float *in_RDX;
  CCountryFlags *in_RDI;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  CCountryFlag *pFlag;
  CQuadItem QuadItem;
  float in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  undefined7 in_stack_ffffffffffffffb0;
  CQuadItem local_1c;
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_CL & 1;
  pCVar4 = GetByCountryCode(in_RDI,(int)in_stack_ffffffffffffff8c);
  if (((bVar1 & 1) == 0) && ((pCVar4->m_Blocked & 1U) != 0)) {
    pCVar4 = GetByCountryCode(in_RDI,(int)in_stack_ffffffffffffff8c);
  }
  bVar2 = IGraphics::CTextureHandle::IsValid((CTextureHandle *)0x15a910);
  if (bVar2) {
    pIVar5 = CComponent::Graphics((CComponent *)0x15a923);
    local_c = (pCVar4->m_Texture).m_Id;
    (*(pIVar5->super_IInterface)._vptr_IInterface[0x13])(pIVar5,(ulong)local_c);
    pIVar5 = CComponent::Graphics((CComponent *)0x15a949);
    (*(pIVar5->super_IInterface)._vptr_IInterface[0x17])();
    pIVar5 = CComponent::Graphics((CComponent *)0x15a95f);
    (*(pIVar5->super_IInterface)._vptr_IInterface[0x21])
              (*in_RDX * in_RDX[3],in_RDX[1] * in_RDX[3],in_RDX[2] * in_RDX[3],in_RDX[3]);
    IGraphics::CQuadItem::CQuadItem(&local_1c,in_XMM0_Da,in_XMM1_Da,in_XMM2_Da,in_XMM3_Da);
    pIVar5 = CComponent::Graphics((CComponent *)0x15a9dc);
    (*(pIVar5->super_IInterface)._vptr_IInterface[0x1d])(pIVar5,&local_1c,1);
    pIVar5 = CComponent::Graphics((CComponent *)0x15a9fc);
    (*(pIVar5->super_IInterface)._vptr_IInterface[0x18])();
  }
  else {
    if (Render(int,vector4_base<float>const*,float,float,float,float,bool)::s_Cursor == '\0') {
      iVar3 = __cxa_guard_acquire(&Render(int,vector4_base<float>const*,float,float,float,float,bool)
                                   ::s_Cursor);
      if (iVar3 != 0) {
        CTextCursor::CTextCursor
                  ((CTextCursor *)CONCAT17(bVar1,in_stack_ffffffffffffffb0),
                   (float)((ulong)pCVar4 >> 0x20),(int)pCVar4);
        __cxa_atexit(CTextCursor::~CTextCursor,&Render::s_Cursor,&__dso_handle);
        __cxa_guard_release(&Render(int,vector4_base<float>const*,float,float,float,float,bool)::
                             s_Cursor);
      }
    }
    CTextCursor::Reset((CTextCursor *)in_RDI,
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    CTextCursor::MoveTo((CTextCursor *)in_RDI,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    Render::s_Cursor.m_MaxLines = (int)in_XMM2_Da;
    Render::s_Cursor.m_Align = 5;
    pIVar6 = CComponent::TextRender((CComponent *)0x15aadc);
    (*(pIVar6->super_IInterface)._vptr_IInterface[0xb])
              (pIVar6,&Render::s_Cursor,pCVar4->m_aCountryCodeString,0xffffffff);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CCountryFlags::Render(int CountryCode, const vec4 *pColor, float x, float y, float w, float h, bool AllowBlocked)
{
	const CCountryFlag *pFlag = GetByCountryCode(CountryCode);
	if(!AllowBlocked && pFlag->m_Blocked)
		pFlag = GetByCountryCode(-1);
	if(pFlag->m_Texture.IsValid())
	{
		Graphics()->TextureSet(pFlag->m_Texture);
		Graphics()->QuadsBegin();
		Graphics()->SetColor(pColor->r*pColor->a, pColor->g*pColor->a, pColor->b*pColor->a, pColor->a);
		IGraphics::CQuadItem QuadItem(x, y, w, h);
		Graphics()->QuadsDrawTL(&QuadItem, 1);
		Graphics()->QuadsEnd();
	}
	else
	{
		static CTextCursor s_Cursor(10.0f);
		s_Cursor.Reset();
		s_Cursor.MoveTo(x+w/2, y+h/2);
		s_Cursor.m_MaxLines = w;
		s_Cursor.m_Align = TEXTALIGN_MC;
		TextRender()->TextOutlined(&s_Cursor, pFlag->m_aCountryCodeString, -1);
	}
}